

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_ref.h
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
absl::lts_20250127::functional_internal::
InvokeObject<google::protobuf::io::Printer::ValidateIndexLookupInBounds(unsigned_long,unsigned_long,unsigned_long,google::protobuf::io::Printer::PrintOptions)::__0,std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,functional_internal *this,VoidPtr ptr)

{
  unsigned_long local_20;
  FormatSpec<char,_unsigned_long,_char> local_18;
  
  local_18.super_type.spec_.data_ = "annotation %c{%d%c is out of bounds";
  local_18.super_type.spec_.size_ = 0x23;
  local_20 = *(long *)(this + 8) + 1;
  StrFormat<char,_unsigned_long,_char>
            (__return_storage_ptr__,&local_18,(char *)(*(long *)this + 0x28),&local_20,
             (char *)(*(long *)this + 0x28));
  return __return_storage_ptr__;
}

Assistant:

R InvokeObject(VoidPtr ptr, typename ForwardT<Args>::type... args) {
  auto o = static_cast<const Obj*>(ptr.obj);
  return static_cast<R>(
      absl::base_internal::invoke(*o, std::forward<Args>(args)...));
}